

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall
Key_NewLinesAreNotAllowed5_Test::~Key_NewLinesAreNotAllowed5_Test
          (Key_NewLinesAreNotAllowed5_Test *this)

{
  Key_NewLinesAreNotAllowed5_Test *this_local;
  
  ~Key_NewLinesAreNotAllowed5_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Key, NewLinesAreNotAllowed5) {
    std::istringstream input("\"key\nkey\" = 123");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(4, e.offset());
    }
}